

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_wav_post_init(ma_wav *pWav)

{
  ma_format mVar1;
  ushort uVar2;
  ma_result in_EAX;
  ma_format mVar3;
  int iVar4;
  
  if (pWav->format != ma_format_unknown) {
    return in_EAX;
  }
  uVar2 = (pWav->dr).translatedFormatTag;
  mVar3 = (ma_format)uVar2;
  if (uVar2 == 3) {
    mVar3 = ma_format_f32;
    mVar1 = ma_format_f32;
    if ((pWav->dr).bitsPerSample != 0x20) goto LAB_001693a6;
  }
  else {
    if ((uVar2 != 1) ||
       (iVar4 = (pWav->dr).bitsPerSample - 8, uVar2 = (ushort)iVar4,
       uVar2 = uVar2 << 0xd | uVar2 >> 3, mVar3 = CONCAT22((short)((uint)iVar4 >> 0x10),uVar2),
       3 < uVar2)) goto LAB_001693a6;
    mVar1 = mVar3 + ma_format_u8 & 0xffff;
  }
  mVar3 = mVar1;
  pWav->format = mVar3;
LAB_001693a6:
  if (pWav->format != ma_format_unknown) {
    return mVar3;
  }
  pWav->format = ma_format_f32;
  return mVar3;
}

Assistant:

static ma_result ma_wav_post_init(ma_wav* pWav)
{
    /*
    If an explicit format was not specified, try picking the closest match based on the internal
    format. The format needs to be supported by miniaudio.
    */
    if (pWav->format == ma_format_unknown) {
        switch (pWav->dr.translatedFormatTag)
        {
            case MA_DR_WAVE_FORMAT_PCM:
            {
                if (pWav->dr.bitsPerSample == 8) {
                    pWav->format = ma_format_u8;
                } else if (pWav->dr.bitsPerSample == 16) {
                    pWav->format = ma_format_s16;
                } else if (pWav->dr.bitsPerSample == 24) {
                    pWav->format = ma_format_s24;
                } else if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_s32;
                }
            } break;

            case MA_DR_WAVE_FORMAT_IEEE_FLOAT:
            {
                if (pWav->dr.bitsPerSample == 32) {
                    pWav->format = ma_format_f32;
                }
            } break;

            default: break;
        }

        /* Fall back to f32 if we couldn't find anything. */
        if (pWav->format == ma_format_unknown) {
            pWav->format =  ma_format_f32;
        }
    }

    return MA_SUCCESS;
}